

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc07_k.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPC07_K>::eval_exc_unpolar_impl
               (double rho,double sigma,double lapl,double tau,double *eps)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  double t118;
  double t114;
  double t112;
  double t111;
  double t110;
  double t109;
  double t108;
  double t107;
  double t105;
  double t104;
  double t103;
  double t102;
  double t99;
  double t98;
  double t96;
  double t95;
  double t94;
  double t93;
  double t92;
  double t90;
  double t88;
  double t86;
  double t84;
  double t83;
  double t82;
  double t80;
  double t79;
  double t78;
  double t77;
  double t76;
  double t75;
  double t74;
  double t71;
  double t69;
  double t68;
  double t67;
  double t66;
  double t64;
  double t63;
  double t62;
  double t60;
  double t59;
  double t58;
  double t55;
  double t53;
  double t52;
  double t51;
  double t43;
  double t41;
  double t39;
  double t38;
  double t36;
  double t34;
  double t33;
  double t24;
  double t23;
  double t22;
  double t21;
  double t19;
  double t18;
  double t16;
  double t15;
  double t13;
  double t12;
  double t10;
  double t9;
  double t8;
  double t3;
  double t91;
  double t89;
  double t87;
  double t50;
  double t49;
  double t47;
  double t32;
  double t30;
  double t29;
  double t28;
  double t5;
  double t31;
  double t27;
  double t26;
  double t25;
  double t6;
  double t4;
  double in_stack_fffffffffffffce8;
  double x;
  
  dVar8 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  x = 1e-15;
  piecewise_functor_5<double>(false,-0.999999999999999,false,0.999999999999999,0.0);
  dVar1 = safe_math::cbrt<double>(1.18658560404142e-317);
  dVar2 = safe_math::cbrt<double>(1.18660783699548e-317);
  dVar1 = piecewise_functor_3<double>(false,dVar1 * dVar1 * x,dVar2 * dVar2);
  dVar2 = safe_math::cbrt<double>(1.18665279696926e-317);
  dVar3 = dVar2 * dVar2;
  dVar4 = in_XMM0_Qa * in_XMM0_Qa;
  dVar5 = dVar8 * 1.5874010519681996 * 0.3949273883044934 * ((1.0 / dVar3) / dVar4);
  dVar6 = dVar5 * 0.06944444444444445;
  dVar7 = safe_math::sqrt<double>(1.18719626917968e-317);
  dVar8 = (((in_XMM2_Qa * 1.5874010519681996 * 0.036567350768934574 * ((1.0 / dVar3) / in_XMM0_Qa) +
             dVar5 * 0.007716049382716049 + 1.0 +
            (in_XMM2_Qa * in_XMM2_Qa * 1.2599210498948732 * 0.1559676420330081 *
            ((1.0 / dVar2) / (dVar4 * in_XMM0_Qa))) / 2916.0) -
           (dVar8 * 0.1559676420330081 *
           ((1.0 / dVar2) / (dVar4 * dVar4)) * 1.2599210498948732 * in_XMM2_Qa) / 2592.0) +
          (dVar8 * dVar8 * 1.2599210498948732 * 0.1559676420330081 *
          ((1.0 / dVar2) / (dVar4 * dVar4 * in_XMM0_Qa))) / 8748.0) * (1.0 / dVar7) - dVar6;
  dVar2 = piecewise_functor_3<double>
                    ((bool)(-((double)(-(ulong)(dVar8 < 0.013472500000000002) & 0x3ff0000000000000)
                             != 0.0) & 1),0.013472500000000002,dVar8);
  piecewise_functor_3<double>
            ((double)(-(ulong)(dVar2 < 0.5254275) & 0x3ff0000000000000) != 0.0,dVar2,0.5254275);
  dVar2 = safe_math::exp<double>(1.18738994291285e-317);
  safe_math::exp<double>(1.18741810465466e-317);
  dVar4 = safe_math::pow<double,double>(x,in_stack_fffffffffffffce8);
  safe_math::exp<double>(1.18747492220394e-317);
  dVar5 = safe_math::pow<double,double>(x,in_stack_fffffffffffffce8);
  dVar2 = piecewise_functor_5<double>
                    ((double)(-(ulong)(dVar8 <= 0.013472500000000002) & 0x3ff0000000000000) != 0.0,
                     0.0,(double)(-(ulong)(0.5254275 <= dVar8) & 0x3ff0000000000000) != 0.0,1.0,
                     dVar2 * dVar4 * (1.0 / dVar5));
  dVar8 = piecewise_functor_3<double>
                    ((double)(-(ulong)(in_XMM0_Qa * 0.5 <= 1e-15) & 0x3ff0000000000000) != 0.0,0.0,
                     dVar1 * dVar3 * 1.4356170000940958 * (dVar8 * dVar2 + dVar6));
  *in_RDI = dVar8 * 2.0;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar_impl( double rho, double sigma, double lapl, double tau, double& eps ) {

    (void)(tau);
    (void)(eps);
    constexpr double t4 = constants::m_cbrt_3;
    constexpr double t6 = constants::m_cbrt_pi;
    constexpr double t25 = constants::m_cbrt_6;
    constexpr double t26 = constants::m_pi_sq;
    constexpr double t27 = constants::m_cbrt_pi_sq;
    constexpr double t31 = constants::m_cbrt_2;
    constexpr double t5 = t4 * t4;
    constexpr double t28 = t27 * t27;
    constexpr double t29 = 0.1e1 / t28;
    constexpr double t30 = t25 * t29;
    constexpr double t32 = t31 * t31;
    constexpr double t47 = t25 * t25;
    constexpr double t49 = 0.1e1 / t27 / t26;
    constexpr double t50 = t47 * t49;
    constexpr double t87 = a / 0.4e2;
    constexpr double t89 = 0.39e2 / 0.4e2 * a;
    constexpr double t91 = a * b;


    const double t3 = rho / 0.2e1 <= dens_tol;
    const double t8 = t5 * t6 * M_PI;
    const double t9 = 0.1e1 <= zeta_tol;
    const double t10 = zeta_tol - 0.1e1;
    const double t12 = piecewise_functor_5( t9, t10, t9, -t10, 0.0 );
    const double t13 = 0.1e1 + t12;
    const double t15 = safe_math::cbrt( zeta_tol );
    const double t16 = t15 * t15;
    const double t18 = safe_math::cbrt( t13 );
    const double t19 = t18 * t18;
    const double t21 = piecewise_functor_3( t13 <= zeta_tol, t16 * zeta_tol, t19 * t13 );
    const double t22 = safe_math::cbrt( rho );
    const double t23 = t22 * t22;
    const double t24 = t21 * t23;
    const double t33 = sigma * t32;
    const double t34 = rho * rho;
    const double t36 = 0.1e1 / t23 / t34;
    const double t38 = t30 * t33 * t36;
    const double t39 = 0.5e1 / 0.72e2 * t38;
    const double t41 = lapl * t32;
    const double t43 = 0.1e1 / t23 / rho;
    const double t51 = lapl * lapl;
    const double t52 = t51 * t31;
    const double t53 = t34 * rho;
    const double t55 = 0.1e1 / t22 / t53;
    const double t58 = t50 * t52 * t55 / 0.2916e4;
    const double t59 = t50 * sigma;
    const double t60 = t34 * t34;
    const double t62 = 0.1e1 / t22 / t60;
    const double t63 = t31 * t62;
    const double t64 = t63 * lapl;
    const double t66 = t59 * t64 / 0.2592e4;
    const double t67 = sigma * sigma;
    const double t68 = t67 * t31;
    const double t69 = t60 * rho;
    const double t71 = 0.1e1 / t22 / t69;
    const double t74 = t50 * t68 * t71 / 0.8748e4;
    const double t75 = 0.1e1 + 0.5e1 / 0.648e3 * t38 + 0.5e1 / 0.54e2 * t30 * t41 * t43 + t58 - t66 + t74;
    const double t76 = t58 - t66 + t74;
    const double t77 = t76 * t76;
    const double t78 = 0.1e1 + t39;
    const double t79 = t78 * t78;
    const double t80 = 0.1e1 / t79;
    const double t82 = t77 * t80 + 0.1e1;
    const double t83 = safe_math::sqrt( t82 );
    const double t84 = 0.1e1 / t83;
    const double t86 = t75 * t84 - t39;
    const double t88 = t86 <= t87;
    const double t90 = t89 <= t86;
    const double t92 = t86 < t87;
    const double t93 = piecewise_functor_3( t92, t87, t86 );
    const double t94 = t93 < t89;
    const double t95 = piecewise_functor_3( t94, t93, t89 );
    const double t96 = 0.1e1 / t95;
    const double t98 = safe_math::exp( -t91 * t96 );
    const double t99 = a - t95;
    const double t102 = safe_math::exp( -a / t99 );
    const double t103 = 0.1e1 + t102;
    const double t104 = safe_math::pow( t103, b );
    const double t105 = t98 * t104;
    const double t107 = safe_math::exp( -a * t96 );
    const double t108 = t107 + t102;
    const double t109 = safe_math::pow( t108, b );
    const double t110 = 0.1e1 / t109;
    const double t111 = t105 * t110;
    const double t112 = piecewise_functor_5( t88, 0.0, t90, 1.0, t111 );
    const double t114 = t86 * t112 + t39;
    const double t118 = piecewise_functor_3( t3, 0.0, 0.3e1 / 0.2e2 * t8 * t24 * t114 );


    eps = 0.2e1 * t118;

  }